

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

uint32_t getSectIDIfAny(Section *sect)

{
  undefined4 local_14;
  Section *sect_local;
  
  if (sect == (Section *)0x0) {
    local_14 = 0xffffffff;
  }
  else {
    local_14 = getsectid(sect);
  }
  return local_14;
}

Assistant:

static uint32_t getSectIDIfAny(struct Section const *sect)
{
	return sect ? getsectid(sect) : (uint32_t)-1;
}